

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_print_help(nn_parse_context *ctx,FILE *stream)

{
  long *plVar1;
  char cVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  size_t width;
  size_t width_00;
  char *__s1;
  nn_option *pnVar9;
  unsigned_long *puVar10;
  long lVar11;
  nn_option *pnVar12;
  
  fwrite("Usage:\n",7,1,(FILE *)stream);
  fprintf((FILE *)stream,"    %s ",*ctx->argv);
  pnVar9 = ctx->options;
  if (pnVar9->longname != (char *)0x0) {
    bVar4 = false;
    lVar11 = 0;
    pcVar8 = "{--%s";
    pnVar12 = pnVar9;
    do {
      if ((pnVar9->mask_set & ctx->requires) == 0) {
        puVar10 = &pnVar12[lVar11 + 1].mask_set;
        do {
          if (((nn_option *)(puVar10 + -5))->longname == (char *)0x0) {
            if (bVar4) goto LAB_00104f8c;
            goto LAB_00104fad;
          }
          lVar11 = lVar11 + 1;
          uVar3 = *puVar10;
          puVar10 = puVar10 + 0xb;
        } while ((uVar3 & ctx->requires) == 0);
      }
      fprintf((FILE *)stream,pcVar8);
      lVar11 = lVar11 + 1;
      pnVar12 = ctx->options;
      pnVar9 = pnVar12 + lVar11;
      bVar4 = true;
      pcVar8 = "|--%s";
    } while (pnVar12[lVar11].longname != (char *)0x0);
LAB_00104f8c:
    fwrite("} ",2,1,(FILE *)stream);
    pnVar12 = ctx->options;
LAB_00104fad:
    if (pnVar12->longname != (char *)0x0) {
      bVar4 = true;
      lVar11 = 0x58;
      do {
        if ((((pnVar12->mask_set & ctx->requires) == 0) && (pnVar12->shortname != '\0')) &&
           (iVar5 = nn_has_arg((nn_option *)(ulong)pnVar12->type), iVar5 == 0)) {
          if (bVar4) {
            bVar4 = false;
            fprintf((FILE *)stream,"[-%c");
          }
          else {
            fputc((int)pnVar12->shortname,(FILE *)stream);
            bVar4 = false;
          }
        }
        pnVar9 = ctx->options;
        pnVar12 = (nn_option *)((long)&pnVar9->longname + lVar11);
        plVar1 = (long *)((long)&pnVar9->longname + lVar11);
        lVar11 = lVar11 + 0x58;
      } while (*plVar1 != 0);
      if (!bVar4) {
        fwrite("] ",2,1,(FILE *)stream);
        pnVar9 = ctx->options;
      }
      if (pnVar9->longname != (char *)0x0) {
        lVar11 = 0x58;
        do {
          if ((((pnVar9->mask_set & ctx->requires) == 0) && (pnVar9->shortname != '\0')) &&
             ((iVar5 = nn_has_arg((nn_option *)(ulong)pnVar9->type), iVar5 != 0 &&
              (pnVar9->metavar != (char *)0x0)))) {
            fprintf((FILE *)stream,"[-%c %s] ",(ulong)(uint)(int)pnVar9->shortname);
          }
          pnVar9 = (nn_option *)((long)&ctx->options->longname + lVar11);
          plVar1 = (long *)((long)&ctx->options->longname + lVar11);
          lVar11 = lVar11 + 0x58;
        } while (*plVar1 != 0);
      }
    }
  }
  fwrite("[options] \n",0xb,1,(FILE *)stream);
  fprintf((FILE *)stream,"\n%s\n",ctx->def->short_description);
  pnVar9 = ctx->options;
  pcVar8 = pnVar9->longname;
  if (pcVar8 != (char *)0x0) {
    lVar11 = 0;
    __s1 = (char *)0x0;
    do {
      if (((__s1 == (char *)0x0) || (__s1 != pnVar9->group)) ||
         (iVar5 = strcmp(__s1,pnVar9->group), iVar5 != 0)) {
        fputc(10,(FILE *)stream);
        fprintf((FILE *)stream,"%s:\n",pnVar9->group);
        pcVar8 = pnVar9->longname;
        __s1 = pnVar9->group;
      }
      fprintf((FILE *)stream," --%s",pcVar8);
      sVar7 = strlen(pnVar9->longname);
      if (pnVar9->shortname == '\0') {
        iVar5 = (int)sVar7 + 3;
      }
      else {
        fprintf((FILE *)stream,",-%c");
        iVar5 = (int)sVar7 + 6;
      }
      iVar6 = nn_has_arg((nn_option *)(ulong)pnVar9->type);
      if (iVar6 != 0) {
        if (pnVar9->metavar == (char *)0x0) {
          fwrite(" ARG",4,1,(FILE *)stream);
          iVar5 = iVar5 + 4;
        }
        else {
          fprintf((FILE *)stream," %s");
          sVar7 = strlen(pnVar9->metavar);
          iVar5 = iVar5 + (int)sVar7 + 1;
        }
      }
      if (iVar5 < 0x17) {
        fputs("\n                        " + (long)iVar5 + 1,(FILE *)stream);
        pcVar8 = nn_print_line(stream,pnVar9->description,width);
      }
      else {
        pcVar8 = pnVar9->description;
      }
      cVar2 = *pcVar8;
      while (cVar2 != '\0') {
        fwrite("\n                        ",0x19,1,(FILE *)stream);
        pcVar8 = nn_print_line(stream,pcVar8,width_00);
        cVar2 = *pcVar8;
      }
      fputc(10,(FILE *)stream);
      lVar11 = lVar11 + 1;
      pnVar9 = ctx->options + lVar11;
      pcVar8 = ctx->options[lVar11].longname;
    } while (pcVar8 != (char *)0x0);
  }
  return;
}

Assistant:

static void nn_print_help (struct nn_parse_context *ctx, FILE *stream)
{
    int i;
    int optlen;
    struct nn_option *opt;
    char *last_group;
    char *cursor;

    fprintf (stream, "Usage:\n");
    nn_print_usage (ctx, stream);
    fprintf (stream, "\n%s\n", ctx->def->short_description);

    last_group = NULL;
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (!last_group || last_group != opt->group ||
            strcmp (last_group, opt->group))
        {
            fprintf (stream, "\n");
            fprintf (stream, "%s:\n", opt->group);
            last_group = opt->group;
        }
        fprintf (stream, " --%s", opt->longname);
        optlen = 3 + strlen (opt->longname);
        if (opt->shortname) {
            fprintf (stream, ",-%c", opt->shortname);
            optlen += 3;
        }
        if (nn_has_arg (opt)) {
            if (opt->metavar) {
                fprintf (stream, " %s", opt->metavar);
                optlen += strlen (opt->metavar) + 1;
            } else {
                fprintf (stream, " ARG");
                optlen += 4;
            }
        }
        if (optlen < 23) {
            fputs (&"                        "[optlen], stream);
            cursor = nn_print_line (stream, opt->description, 80-24);
        } else {
            cursor = opt->description;
        }
        while (*cursor) {
            fprintf (stream, "\n                        ");
            cursor = nn_print_line (stream, cursor, 80-24);
        }
        fprintf (stream, "\n");
    }
}